

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# credits.c
# Opt level: O0

void init_credits(void)

{
  text_char = 0xffff;
  text_width = 0;
  text_pix = 0;
  text_scroll = 0;
  cred = (CREDIT_NAME *)0x0;
  credit_width = 0;
  credit_scroll = 0;
  credit_age = 0;
  credit_speed = 0x20;
  credit_skip = 1;
  load_text();
  load_credits();
  return;
}

Assistant:

void init_credits(void)
{
   /* for the text scroller */
   text_char = 0xFFFF;
   text_width = 0;
   text_pix = 0;
   text_scroll = 0;

   /* for the credits display */
   cred = NULL;
   credit_width = 0;
   credit_scroll = 0;
   credit_age = 0;
   credit_speed = 32;
   credit_skip = 1;

   load_text();
   load_credits();
}